

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<absl::lts_20250127::Cord>::Swap
          (RepeatedField<absl::lts_20250127::Cord> *this,
          RepeatedField<absl::lts_20250127::Cord> *other)

{
  ulong uVar1;
  int iVar2;
  Arena *pAVar3;
  Arena *arena;
  HeapRep *pHVar4;
  Cord *this_00;
  long lVar5;
  RepeatedField<absl::lts_20250127::Cord> temp;
  ShortSooRep SStack_38;
  
  if (this != other) {
    if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
        (undefined1  [16])0x0) {
      pAVar3 = internal::SooRep::soo_arena(&this->soo_rep_);
    }
    else {
      pHVar4 = heap_rep(this);
      pAVar3 = (pHVar4->field_0).arena;
    }
    if ((undefined1  [16])((undefined1  [16])(other->soo_rep_).field_0 & (undefined1  [16])0x4) ==
        (undefined1  [16])0x0) {
      arena = internal::SooRep::soo_arena(&other->soo_rep_);
    }
    else {
      pHVar4 = heap_rep(other);
      arena = (pHVar4->field_0).arena;
    }
    if (pAVar3 == arena) {
      InternalSwap(this,other);
      return;
    }
    internal::ShortSooRep::ShortSooRep(&SStack_38,arena);
    MergeFrom((RepeatedField<absl::lts_20250127::Cord> *)&SStack_38,this);
    uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
    if ((uVar1 & 4) == 0) {
      this_00 = (Cord *)((long)&(this->soo_rep_).field_0 + 8);
    }
    else {
      this_00 = (Cord *)internal::LongSooRep::elements((LongSooRep *)this);
    }
    iVar2 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
    if (iVar2 != 0) {
      lVar5 = (long)iVar2 << 4;
      do {
        absl::lts_20250127::Cord::~Cord(this_00);
        this_00 = this_00 + 1;
        lVar5 = lVar5 + -0x10;
      } while (lVar5 != 0);
    }
    iVar2 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
    if ((iVar2 != 0) &&
       ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
        (undefined1  [16])0x0)) {
      internal::LongSooRep::elements((LongSooRep *)this);
    }
    set_size(this,(uVar1 & 4) == 0,0);
    MergeFrom(this,other);
    UnsafeArenaSwap(other,(RepeatedField<absl::lts_20250127::Cord> *)&SStack_38);
    ~RepeatedField((RepeatedField<absl::lts_20250127::Cord> *)&SStack_38);
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  Arena* arena = GetArena();
  Arena* other_arena = other->GetArena();
  if (internal::CanUseInternalSwap(arena, other_arena)) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other_arena);
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}